

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d *
tinyusdz::inverse_pxr(matrix3d *__return_storage_ptr__,matrix3d *m,double *detp,double eps)

{
  float fVar1;
  double dVar2;
  undefined1 local_c0 [80];
  double rcp;
  double det;
  double a22;
  double a21;
  double a20;
  double a12;
  double a11;
  double a10;
  double a02;
  double a01;
  double a00;
  double eps_local;
  double *detp_local;
  matrix3d *m_local;
  
  a01 = m->m[0][0];
  a02 = m->m[0][1];
  a10 = m->m[0][2];
  a11 = m->m[1][0];
  a12 = m->m[1][1];
  a20 = m->m[1][2];
  a21 = m->m[2][0];
  a22 = m->m[2][1];
  det = m->m[2][2];
  rcp = a01 * a12 * det +
        -(a02 * a11) * det +
        -(a01 * a20) * a22 + a10 * a11 * a22 + -(a10 * a12) * a21 + a02 * a20 * a21;
  if (detp != (double *)0x0) {
    *detp = rcp;
  }
  a00 = eps;
  eps_local = (double)detp;
  detp_local = (double *)m;
  value::matrix3d::matrix3d(__return_storage_ptr__);
  if (ABS(rcp) <= a00) {
    value::matrix3d::identity();
    memcpy(__return_storage_ptr__,local_c0,0x48);
    fVar1 = ::std::numeric_limits<float>::max();
    __return_storage_ptr__->m[0][0] = (double)fVar1;
    fVar1 = ::std::numeric_limits<float>::max();
    __return_storage_ptr__->m[1][1] = (double)fVar1;
    fVar1 = ::std::numeric_limits<float>::max();
    __return_storage_ptr__->m[2][2] = (double)fVar1;
  }
  else {
    dVar2 = 1.0 / rcp;
    __return_storage_ptr__->m[0][0] = (-a20 * a22 + a12 * det) * dVar2;
    __return_storage_ptr__->m[0][1] = (a10 * a22 + -(a02 * det)) * dVar2;
    __return_storage_ptr__->m[0][2] = (-a10 * a12 + a02 * a20) * dVar2;
    __return_storage_ptr__->m[1][0] = (a20 * a21 + -(a11 * det)) * dVar2;
    __return_storage_ptr__->m[1][1] = (-a10 * a21 + a01 * det) * dVar2;
    __return_storage_ptr__->m[1][2] = (a10 * a11 + -(a01 * a20)) * dVar2;
    __return_storage_ptr__->m[2][0] = (-a12 * a21 + a11 * a22) * dVar2;
    __return_storage_ptr__->m[2][1] = (a02 * a21 + -(a01 * a22)) * dVar2;
    __return_storage_ptr__->m[2][2] = (-a02 * a11 + a01 * a12) * dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d inverse_pxr(const value::matrix3d &m, double *detp,
                            double eps) {
  double a00, a01, a02, a10, a11, a12, a20, a21, a22;
  double det, rcp;

  a00 = m.m[0][0];
  a01 = m.m[0][1];
  a02 = m.m[0][2];
  a10 = m.m[1][0];
  a11 = m.m[1][1];
  a12 = m.m[1][2];
  a20 = m.m[2][0];
  a21 = m.m[2][1];
  a22 = m.m[2][2];
  det = -(a02 * a11 * a20) + a01 * a12 * a20 + a02 * a10 * a21 -
        a00 * a12 * a21 - a01 * a10 * a22 + a00 * a11 * a22;

  if (detp) {
    *detp = det;
  }

  value::matrix3d inv;

  if (std::fabs(det) > eps) {
    rcp = 1.0 / det;
    inv.m[0][0] = (-(a12 * a21) + a11 * a22) * rcp;
    inv.m[0][1] = (a02 * a21 - a01 * a22) * rcp;
    inv.m[0][2] = (-(a02 * a11) + a01 * a12) * rcp;
    inv.m[1][0] = (a12 * a20 - a10 * a22) * rcp;
    inv.m[1][1] = (-(a02 * a20) + a00 * a22) * rcp;
    inv.m[1][2] = (a02 * a10 - a00 * a12) * rcp;
    inv.m[2][0] = (-(a11 * a20) + a10 * a21) * rcp;
    inv.m[2][1] = (a01 * a20 - a00 * a21) * rcp;
    inv.m[2][2] = (-(a01 * a10) + a00 * a11) * rcp;

  } else {
    inv = value::matrix3d::identity();
    // scale = FLT_MAX
    inv.m[0][0] = double((std::numeric_limits<float>::max)());
    inv.m[1][1] = double((std::numeric_limits<float>::max)());
    inv.m[2][2] = double((std::numeric_limits<float>::max)());
  }

  return inv;
}